

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

bool __thiscall spv::Builder::isSpecConstantOpCode(Builder *this,Op opcode)

{
  if ((4 < opcode - OpSpecConstantTrue) && (opcode != OpSpecConstantCompositeReplicateEXT)) {
    return false;
  }
  return true;
}

Assistant:

bool Builder::isSpecConstantOpCode(Op opcode) const
{
    switch (opcode) {
    case OpSpecConstantTrue:
    case OpSpecConstantFalse:
    case OpSpecConstant:
    case OpSpecConstantComposite:
    case OpSpecConstantOp:
    case OpSpecConstantCompositeReplicateEXT:
        return true;
    default:
        return false;
    }
}